

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O0

void __thiscall mock_visitor<bool>::mock_visitor(mock_visitor<bool> *this)

{
  Action<test_result_(bool)> *in_stack_00000008;
  OnCallSpec<test_result_(bool)> *in_stack_00000010;
  char *in_stack_00000060;
  char *in_stack_00000068;
  char *in_stack_00000078;
  MockSpec<test_result_(bool)> *in_stack_00000080;
  AnythingMatcher *in_stack_ffffffffffffff88;
  mock_visitor<bool> *in_stack_ffffffffffffff90;
  ReturnAction<test_result> *in_stack_ffffffffffffffb8;
  
  testing::internal::FunctionMocker<test_result_(bool)>::FunctionMocker
            (&in_stack_ffffffffffffff90->gmock1_visit_268);
  testing::internal::FunctionMocker<void_()>::FunctionMocker
            ((FunctionMocker<void_()> *)in_stack_ffffffffffffff90);
  testing::internal::AnythingMatcher::operator_cast_to_Matcher(in_stack_ffffffffffffff88);
  gmock_visit(in_stack_ffffffffffffff90,(Matcher<bool> *)in_stack_ffffffffffffff88);
  testing::internal::MockSpec<test_result_(bool)>::InternalDefaultActionSetAt
            (in_stack_00000080,in_stack_00000078,this._4_4_,in_stack_00000068,in_stack_00000060);
  testing::Return<test_result>();
  testing::internal::ReturnAction::operator_cast_to_Action(in_stack_ffffffffffffffb8);
  testing::internal::OnCallSpec<test_result_(bool)>::WillByDefault
            (in_stack_00000010,in_stack_00000008);
  testing::Action<test_result_(bool)>::~Action((Action<test_result_(bool)> *)0x13b35c);
  testing::Matcher<bool>::~Matcher((Matcher<bool> *)0x13b366);
  return;
}

Assistant:

mock_visitor() {
    ON_CALL(*this, visit(_)).WillByDefault(testing::Return(test_result()));
  }